

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

string * jsonnet::internal::jsonnet_vm_execute
                   (string *__return_storage_ptr__,Allocator *alloc,AST *ast,ExtMap *ext_vars,
                   uint max_stack,double gc_min_objects,double gc_growth_trigger,
                   VmNativeCallbackMap *natives,JsonnetImportCallback *import_callback,void *ctx,
                   bool string_output)

{
  Interpreter vm;
  long *local_2a0;
  long local_298;
  long local_290 [2];
  UString local_280;
  LocationRange local_260;
  UString local_220;
  Interpreter local_200;
  
  anon_unknown_0::Interpreter::Interpreter
            (&local_200,alloc,ext_vars,max_stack,gc_min_objects,gc_growth_trigger,natives,
             import_callback,ctx);
  anon_unknown_0::Interpreter::evaluate(&local_200,ast,0);
  local_2a0 = local_290;
  if (string_output) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"During manifestation","");
    local_260.file._M_dataplus._M_p = (pointer)&local_260.file.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,local_2a0,local_298 + (long)local_2a0);
    local_260.end.line = 0;
    local_260.end.column = 0;
    local_260.begin.line = 0;
    local_260.begin.column = 0;
    (anonymous_namespace)::Interpreter::manifestString_abi_cxx11_
              (&local_280,(Interpreter *)&local_200,&local_260);
    encode_utf8(__return_storage_ptr__,&local_280);
    local_220.field_2._M_allocated_capacity = local_280.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_280._M_dataplus._M_p == &local_280.field_2) goto LAB_001adf47;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"During manifestation","");
    local_260.file._M_dataplus._M_p = (pointer)&local_260.file.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,local_2a0,local_298 + (long)local_2a0);
    local_260.end.line = 0;
    local_260.end.column = 0;
    local_260.begin.line = 0;
    local_260.begin.column = 0;
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_220,L"");
    anon_unknown_0::Interpreter::manifestJson(&local_280,&local_200,&local_260,true,&local_220);
    encode_utf8(__return_storage_ptr__,&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity * 4 + 4);
    }
    local_280._M_dataplus._M_p = local_220._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_220._M_dataplus._M_p == &local_220.field_2) goto LAB_001adf47;
  }
  operator_delete(local_280._M_dataplus._M_p,local_220.field_2._M_allocated_capacity * 4 + 4);
LAB_001adf47:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.file._M_dataplus._M_p != &local_260.file.field_2) {
    operator_delete(local_260.file._M_dataplus._M_p,local_260.file.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_2a0 != local_290) {
    operator_delete(local_2a0,local_290[0] + 1);
  }
  anon_unknown_0::Interpreter::~Interpreter(&local_200);
  return __return_storage_ptr__;
}

Assistant:

std::string jsonnet_vm_execute(Allocator *alloc, const AST *ast, const ExtMap &ext_vars,
                               unsigned max_stack, double gc_min_objects, double gc_growth_trigger,
                               const VmNativeCallbackMap &natives,
                               JsonnetImportCallback *import_callback, void *ctx,
                               bool string_output)
{
    Interpreter vm(alloc,
                   ext_vars,
                   max_stack,
                   gc_min_objects,
                   gc_growth_trigger,
                   natives,
                   import_callback,
                   ctx);
    vm.evaluate(ast, 0);
    if (string_output) {
        return encode_utf8(vm.manifestString(LocationRange("During manifestation")));
    } else {
        return encode_utf8(vm.manifestJson(LocationRange("During manifestation"), true, U""));
    }
}